

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

void __thiscall
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
          (ThreadLocal<testing::TestPartResultReporterInterface_*> *this)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  GTestLog local_14;
  
  plVar2 = (long *)pthread_getspecific(this->key_);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))(plVar2);
  }
  iVar1 = pthread_key_delete(this->key_);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O2/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x6ee);
    poVar3 = std::operator<<((ostream *)&std::cerr,"pthread_key_delete(key_)");
    poVar3 = std::operator<<(poVar3,"failed with error ");
    std::ostream::operator<<(poVar3,iVar1);
    GTestLog::~GTestLog(&local_14);
  }
  std::
  unique_ptr<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory,_std::default_delete<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::ValueHolderFactory>_>
  ::~unique_ptr(&this->default_factory_);
  return;
}

Assistant:

~ThreadLocal() {
    // Destroys the managed object for the current thread, if any.
    DeleteThreadLocalValue(pthread_getspecific(key_));

    // Releases resources associated with the key.  This will *not*
    // delete managed objects for other threads.
    GTEST_CHECK_POSIX_SUCCESS_(pthread_key_delete(key_));
  }